

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask4_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  
  uVar1 = in[10];
  uVar2 = in[0xb];
  uVar3 = in[0xe];
  uVar4 = in[0xc];
  *out = in[7] << 0x1c |
         in[6] << 0x18 | in[5] << 0x14 | in[4] << 0x10 | in[3] << 0xc | in[2] << 8 |
         in[1] << 4 | *in;
  uVar5 = in[0x12];
  uVar6 = in[0x13];
  uVar7 = in[0x16];
  uVar8 = in[0x14];
  out[1] = in[0xf] << 0x1c |
           uVar3 << 0x18 | in[0xd] << 0x14 | uVar4 << 0x10 | uVar2 << 0xc | uVar1 << 8 |
           in[9] << 4 | in[8];
  out[2] = in[0x17] << 0x1c |
           uVar7 << 0x18 | in[0x15] << 0x14 | uVar8 << 0x10 | uVar6 << 0xc | uVar5 << 8 |
           in[0x11] << 4 | in[0x10];
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask4_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;

  return out;
}